

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d64_q1b_password.cpp
# Opt level: O0

int main(void)

{
  ulong uVar1;
  char cVar2;
  undefined1 auVar3 [16];
  pointer __n;
  bool bVar4;
  istream *piVar5;
  reference pvVar6;
  char *pcVar7;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_110;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_108;
  int local_fc;
  string local_f8 [4];
  int j;
  string tmp_1;
  int local_d4;
  int i_2;
  string local_c0 [8];
  string tmp;
  ulong local_a0;
  size_t i_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hashed_password;
  size_t i;
  allocator<unsigned_long> local_41;
  undefined1 local_40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> v;
  size_t k;
  size_t m;
  size_t n;
  
  n._4_4_ = 0;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  piVar5 = (istream *)std::istream::operator>>((istream *)&std::cin,&m);
  piVar5 = (istream *)std::istream::operator>>(piVar5,&k);
  std::istream::operator>>
            (piVar5,(ulong *)&v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  __n = v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  std::allocator<unsigned_long>::allocator(&local_41);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,(size_type)__n,
             &local_41);
  std::allocator<unsigned_long>::~allocator(&local_41);
  for (hashed_password._M_h._M_single_bucket = (__node_base_ptr)0x0;
      hashed_password._M_h._M_single_bucket <
      v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage;
      hashed_password._M_h._M_single_bucket =
           (__node_base_ptr)((long)&(hashed_password._M_h._M_single_bucket)->_M_nxt + 1)) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                        (size_type)hashed_password._M_h._M_single_bucket);
    std::istream::operator>>((istream *)&std::cin,pvVar6);
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&i_1);
  for (local_a0 = 0; local_a0 < m; local_a0 = local_a0 + 1) {
    std::__cxx11::string::string(local_c0);
    std::operator>>((istream *)&std::cin,local_c0);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&i_1,(value_type *)local_c0);
    std::__cxx11::string::~string(local_c0);
  }
  for (local_d4 = 0; (ulong)(long)local_d4 < k; local_d4 = local_d4 + 1) {
    std::__cxx11::string::string(local_f8);
    std::operator>>((istream *)&std::cin,local_f8);
    for (local_fc = 0;
        (pointer)(long)local_fc <
        v.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage; local_fc = local_fc + 1) {
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
      cVar2 = *pcVar7;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40,
                          (long)local_fc);
      uVar1 = (long)cVar2 + -0x61 + *pvVar6;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_f8);
      *pcVar7 = (char)uVar1 + (char)(SUB164(auVar3 * ZEXT816(0x4ec4ec4ec4ec4ec5),8) >> 3) * -0x1a +
                'a';
    }
    local_108._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&i_1,(key_type *)local_f8);
    local_110._M_cur =
         (__node_type *)
         std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&i_1);
    bVar4 = std::__detail::operator!=(&local_108,&local_110);
    pcVar7 = "Unknown\n";
    if (bVar4) {
      pcVar7 = "Match\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar7);
    std::__cxx11::string::~string(local_f8);
  }
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&i_1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_40);
  return n._4_4_;
}

Assistant:

int main() {
    std::ios::sync_with_stdio(false);
    std::cin.tie(nullptr);
    size_t n, m, k;
    cin >> n >> m >> k;
    vector<size_t> v(k);
    for (size_t i = 0; i < k; ++i) {
        cin >> v[i];
    }
    unordered_set<string> hashed_password;
    for (size_t i = 0; i < n; ++i) {
        string tmp;
        cin >> tmp;
        hashed_password.insert(tmp);
    }
    for (int i = 0; i < m; ++i) {
        string tmp;
        cin >> tmp;
        for (int j = 0; j < k; ++j) {
            tmp[j] = (tmp[j] + v[j] - 'a') % 26 + 'a';
        }
        cout << ((hashed_password.find(tmp) != hashed_password.end())
                     ? "Match\n"
                     : "Unknown\n");
    }
}